

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_field.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::objectivec::FieldGeneratorMap::DoesAnyFieldHaveNonZeroDefault
          (FieldGeneratorMap *this)

{
  bool bVar1;
  Descriptor *pDVar2;
  long lVar3;
  long lVar4;
  
  pDVar2 = this->descriptor_;
  if (*(int *)(pDVar2 + 4) < 1) {
    bVar1 = false;
  }
  else {
    lVar3 = 0;
    lVar4 = 0;
    do {
      bVar1 = HasNonZeroDefaultValue((FieldDescriptor *)(*(long *)(pDVar2 + 0x28) + lVar3));
      if (bVar1) {
        return bVar1;
      }
      lVar4 = lVar4 + 1;
      pDVar2 = this->descriptor_;
      lVar3 = lVar3 + 0x48;
    } while (lVar4 < *(int *)(pDVar2 + 4));
  }
  return bVar1;
}

Assistant:

bool FieldGeneratorMap::DoesAnyFieldHaveNonZeroDefault(void) const {
  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (HasNonZeroDefaultValue(descriptor_->field(i))) {
      return true;
    }
  }

  return false;
}